

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall
duckdb_re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  Regexp *this_00;
  ParseFlags PVar1;
  Regexp **ppRVar2;
  Regexp *pRVar3;
  void *pvVar4;
  undefined8 *in_RCX;
  undefined1 *in_RDX;
  Regexp *in_RDI;
  int nrunes;
  Rune *runes;
  bool latin1;
  int j;
  Regexp *re;
  int i;
  ParseFlags in_stack_ffffffffffffff68;
  RegexpOp in_stack_ffffffffffffff6c;
  undefined1 latin1_00;
  Regexp *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff94;
  Regexp *in_stack_ffffffffffffffb8;
  int local_3c;
  int local_2c;
  bool local_1;
  
  std::__cxx11::string::clear();
  *in_RDX = 0;
  *in_RCX = 0;
  if (in_RDI->op_ == '\x05') {
    local_2c = 0;
    while( true ) {
      in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 & 0xffffff;
      if (local_2c < (int)(uint)in_RDI->nsub_) {
        ppRVar2 = sub(in_RDI);
        in_stack_ffffffffffffff94 =
             CONCAT13(ppRVar2[local_2c]->op_ == '\x12',(int3)in_stack_ffffffffffffff94);
      }
      if ((char)(in_stack_ffffffffffffff94 >> 0x18) == '\0') break;
      local_2c = local_2c + 1;
    }
    if ((local_2c == 0) || ((int)(uint)in_RDI->nsub_ <= local_2c)) {
      local_1 = false;
    }
    else {
      ppRVar2 = sub(in_RDI);
      this_00 = ppRVar2[local_2c];
      if ((this_00->op_ == '\x03') || (this_00->op_ == '\x04')) {
        local_2c = local_2c + 1;
        local_3c = local_2c;
        if (local_2c < (int)(uint)in_RDI->nsub_) {
          for (; local_3c < (int)(uint)in_RDI->nsub_; local_3c = local_3c + 1) {
            sub(in_RDI);
            Incref(in_stack_ffffffffffffffb8);
          }
          ppRVar2 = sub(in_RDI);
          in_stack_ffffffffffffff88 = (string *)(ppRVar2 + local_2c);
          parse_flags(in_RDI);
          pRVar3 = Concat((Regexp **)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68);
          *in_RCX = pRVar3;
        }
        else {
          pvVar4 = operator_new(0x28);
          parse_flags(in_RDI);
          Regexp(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
          *in_RCX = pvVar4;
        }
        PVar1 = parse_flags(this_00);
        operator&(PVar1,Latin1);
        if (this_00->op_ == '\x03') {
          latin1_00 = false;
        }
        else {
          latin1_00 = (undefined1)((uint)(this_00->arguments).repeat.max_ >> 0x18);
        }
        ConvertRunesToBytes((bool)latin1_00,(Rune *)in_RDI,in_stack_ffffffffffffff94,
                            in_stack_ffffffffffffff88);
        PVar1 = parse_flags(this_00);
        PVar1 = operator&(PVar1,FoldCase);
        *in_RDX = PVar1 != NoParseFlags;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Regexp::RequiredPrefix(std::string* prefix, bool* foldcase,
                            Regexp** suffix) {
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;

  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  if (op_ != kRegexpConcat)
    return false;
  int i = 0;
  while (i < nsub_ && sub()[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;
  Regexp* re = sub()[i];
  if (re->op_ != kRegexpLiteral &&
      re->op_ != kRegexpLiteralString)
    return false;
  i++;
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub()[j]->Incref();
    *suffix = Concat(sub() + i, nsub_ - i, parse_flags());
  } else {
    *suffix = new Regexp(kRegexpEmptyMatch, parse_flags());
  }

  bool latin1 = (re->parse_flags() & Latin1) != 0;
  Rune* runes = re->op_ == kRegexpLiteral ? &re->arguments.rune_ : re->arguments.literal_string.runes_;
  int nrunes = re->op_ == kRegexpLiteral ? 1 : re->arguments.literal_string.nrunes_;
  ConvertRunesToBytes(latin1, runes, nrunes, prefix);
  *foldcase = (re->parse_flags() & FoldCase) != 0;
  return true;
}